

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O1

void __thiscall MT32Emu::BReverbModelImpl<float>::mute(BReverbModelImpl<float> *this)

{
  AllpassFilter<float> **ppAVar1;
  AllpassFilter<float> *pAVar2;
  float *pfVar3;
  CombFilter<float> **ppCVar4;
  CombFilter<float> *pCVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  ppAVar1 = this->allpasses;
  if ((ppAVar1 != (AllpassFilter<float> **)0x0) &&
     (uVar7 = (ulong)this->currentSettings->numberOfAllpasses, uVar7 != 0)) {
    uVar8 = 0;
    do {
      pAVar2 = ppAVar1[uVar8];
      pfVar3 = (pAVar2->super_RingBuffer<float>).buffer;
      uVar6 = (ulong)(pAVar2->super_RingBuffer<float>).size;
      if (pfVar3 != (float *)0x0 && uVar6 != 0) {
        memset(pfVar3,0,uVar6 << 2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  ppCVar4 = this->combs;
  if ((ppCVar4 != (CombFilter<float> **)0x0) &&
     (uVar7 = (ulong)this->currentSettings->numberOfCombs, uVar7 != 0)) {
    uVar8 = 0;
    do {
      pCVar5 = ppCVar4[uVar8];
      pfVar3 = (pCVar5->super_RingBuffer<float>).buffer;
      uVar6 = (ulong)(pCVar5->super_RingBuffer<float>).size;
      if (pfVar3 != (float *)0x0 && uVar6 != 0) {
        memset(pfVar3,0,uVar6 << 2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

void mute() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i]->mute();
			}
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				combs[i]->mute();
			}
		}
	}